

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

Node * __thiscall Node::ParenString_abi_cxx11_(Node *this)

{
  char *pcVar1;
  int *in_RSI;
  undefined1 local_f8 [40];
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  undefined1 local_90 [56];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  Node *this_local;
  
  this_local = this;
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)(in_RSI + 2));
  if ((*pcVar1 == '\"') ||
     (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)(in_RSI + 2)), *pcVar1 == '\'')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"std::string(",(allocator *)(local_90 + 0x37));
    Expression_abi_cxx11_((Node *)local_90);
    std::operator+(local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)local_38);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)(local_90 + 0x37));
  }
  else if ((*in_RSI == 0x2b) || (*in_RSI == 0x2d)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"(",(allocator *)(local_f8 + 0x27));
    Expression_abi_cxx11_((Node *)local_f8);
    std::operator+(local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)(local_f8 + 0x27));
  }
  else {
    Expression_abi_cxx11_(this);
  }
  return this;
}

Assistant:

std::string Node::ParenString(void)
{
	if (TextValue[0] == '"' || TextValue[0] == '\'')
	{
		return std::string("std::string(") +
			Expression() + ")";
	}
	else
	{
		switch(Type)
		{
		// Add other operations as needed
		case '+':
		case '-':
			return std::string("(") + Expression() + ")";

	//	case  '(':
		default:
			return Expression();
		}
	}
}